

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBlock::FinalizeAllObjects(LargeHeapBlock *this)

{
  size_t *psVar1;
  undefined4 *puVar2;
  HeapInfo *pHVar3;
  code *pcVar4;
  uchar uVar5;
  bool bVar6;
  LargeObjectHeader *pLVar7;
  LargeObjectHeader *pLVar8;
  uint i;
  uint index;
  uint uVar9;
  undefined8 *in_FS_OFFSET;
  
  if (this->finalizeCount != 0) {
    uVar9 = 0;
    for (index = 0; index < this->allocCount; index = index + 1) {
      pLVar7 = GetHeaderByIndex(this,index);
      if (pLVar7 != (LargeObjectHeader *)0x0) {
        uVar5 = LargeObjectHeader::GetAttributes(pLVar7,this->heapInfo->recycler->Cookie);
        if ((char)uVar5 < '\0') {
          (*(code *)**(undefined8 **)(pLVar7 + 1))(pLVar7 + 1,1);
          (**(code **)(*(long *)(pLVar7 + 1) + 8))(pLVar7 + 1,1);
          psVar1 = &this->heapInfo->liveFinalizableObjectCount;
          *psVar1 = *psVar1 - 1;
          uVar9 = uVar9 + 1;
        }
      }
    }
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    while (pLVar7 = this->pendingDisposeObject, pLVar7 != (LargeObjectHeader *)0x0) {
      pLVar8 = LargeObjectHeader::GetNext(pLVar7,this->heapInfo->recycler->Cookie);
      this->pendingDisposeObject = pLVar8;
      uVar5 = LargeObjectHeader::GetAttributes(pLVar7,this->heapInfo->recycler->Cookie);
      if (-1 < (char)uVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x11f,
                           "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)"
                           ,"header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit")
        ;
        if (!bVar6) goto LAB_0026674a;
        *puVar2 = 0;
      }
      if ((&this[1].super_HeapBlock._vptr_HeapBlock)[pLVar7->objectIndex] != (_func_int **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x120,"(this->HeaderList()[header->objectIndex] == nullptr)",
                           "this->HeaderList()[header->objectIndex] == nullptr");
        if (!bVar6) goto LAB_0026674a;
        *puVar2 = 0;
      }
      (**(code **)(*(long *)(pLVar7 + 1) + 8))(pLVar7 + 1,1);
      pHVar3 = this->heapInfo;
      psVar1 = &pHVar3->liveFinalizableObjectCount;
      *psVar1 = *psVar1 - 1;
      psVar1 = &pHVar3->pendingDisposableObjectCount;
      *psVar1 = *psVar1 - 1;
      uVar9 = uVar9 + 1;
    }
    if (this->finalizeCount != uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar2 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,299,"(this->finalizeCount == processedCount)",
                         "this->finalizeCount == processedCount");
      if (!bVar6) {
LAB_0026674a:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar2 = 0;
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::FinalizeAllObjects()
{
    if (this->finalizeCount != 0)
    {
        DebugOnly(uint processedCount = 0);
        for (uint i = 0; i < allocCount; i++)
        {
            LargeObjectHeader * header = this->GetHeaderByIndex(i);
            if (header == nullptr || ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) == 0))
            {
                continue;
            }

            FinalizableObject * finalizableObject = ((FinalizableObject *)header->GetAddress());

            finalizableObject->Finalize(true);
            finalizableObject->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapInfo->liveFinalizableObjectCount--;
#endif
            DebugOnly(processedCount++);
        }

        while (pendingDisposeObject != nullptr)
        {
            LargeObjectHeader * header = pendingDisposeObject;
            pendingDisposeObject = header->GetNext(this->heapInfo->recycler->Cookie);
            Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);
            Assert(this->HeaderList()[header->objectIndex] == nullptr);

            void * objectAddress = header->GetAddress();
            ((FinalizableObject *)objectAddress)->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapInfo->liveFinalizableObjectCount--;
            this->heapInfo->pendingDisposableObjectCount--;
#endif
            DebugOnly(processedCount++);
        }

        Assert(this->finalizeCount == processedCount);
    }
}